

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O0

void __thiscall Js::DelayedFreeArrayBuffer::ClearAll(DelayedFreeArrayBuffer *this)

{
  bool bVar1;
  DelayedFreeArrayBuffer *this_local;
  
  bVar1 = HasAnyItem(this);
  if (bVar1) {
    SListBase<Js::ArrayBufferContentForDelayedFreeBase*,Memory::HeapAllocator,RealCount>::
    Map<Js::DelayedFreeArrayBuffer::ClearAll()::__0>
              ((SListBase<Js::ArrayBufferContentForDelayedFreeBase*,Memory::HeapAllocator,RealCount>
                *)this);
    SList<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>::Clear
              (&this->listOfBuffers);
  }
  return;
}

Assistant:

void DelayedFreeArrayBuffer::ClearAll()
    {
        if (HasAnyItem())
        {
            this->listOfBuffers.Map([](Js::ArrayBufferContentForDelayedFreeBase* item) {
                item->Release();
                item->ClearSelfOnly();
            });

            this->listOfBuffers.Clear();
        }
    }